

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  BBox1f BVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  bool bVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  size_t *psVar22;
  uint uVar23;
  size_t sVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 extraout_var [56];
  float fVar30;
  float fVar31;
  float fVar36;
  float fVar37;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar60;
  undefined1 auVar59 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  float fVar65;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar63._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar63._8_56_ = extraout_var;
  auVar32._8_8_ = 0;
  auVar32._0_4_ = time_range->lower;
  auVar32._4_4_ = time_range->upper;
  auVar27 = auVar63._0_16_;
  auVar28 = vcmpps_avx(auVar27,auVar32,1);
  auVar29 = vblendps_avx(auVar32,auVar27,2);
  auVar27 = vinsertps_avx(auVar27,auVar32,0x50);
  auVar29 = vblendvps_avx(auVar27,auVar29,auVar28);
  auVar28 = vmovshdup_avx(auVar29);
  fVar25 = auVar29._0_4_;
  fVar30 = auVar28._0_4_;
  if (fVar25 <= fVar30) {
    uVar13 = r->_begin;
    local_68 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                lower.field_0.m128;
    local_78 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                upper.field_0.m128;
    local_88 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                lower.field_0.m128;
    local_98 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                upper.field_0.m128;
    sVar12 = __return_storage_ptr__->end;
    if (uVar13 < r->_end) {
      auVar63 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar64 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      do {
        BVar6 = (this->super_Points).super_Geometry.time_range;
        auVar28._8_8_ = 0;
        auVar28._0_4_ = BVar6.lower;
        auVar28._4_4_ = BVar6.upper;
        fVar2 = (this->super_Points).super_Geometry.fnumTimeSegments;
        auVar29 = vmovshdup_avx(auVar28);
        auVar29 = vsubps_avx(auVar29,auVar28);
        uVar20 = uVar13 & 0xffffffff;
        pBVar7 = (this->super_Points).vertices.items;
        if (uVar20 < (pBVar7->super_RawBufferView).num) {
          auVar28 = ZEXT416((uint)(fVar2 * ((fVar30 - BVar6.lower) / auVar29._0_4_) * 0.99999976));
          auVar28 = vroundss_avx(auVar28,auVar28,10);
          auVar28 = vminss_avx(auVar28,ZEXT416((uint)fVar2));
          uVar23 = (uint)auVar28._0_4_;
          auVar29 = ZEXT416((uint)(fVar2 * ((fVar25 - BVar6.lower) / auVar29._0_4_) * 1.0000002));
          auVar29 = vroundss_avx(auVar29,auVar29,9);
          auVar29 = vmaxss_avx(ZEXT816(0) << 0x20,auVar29);
          uVar14 = (uint)auVar29._0_4_;
          bVar9 = uVar23 < uVar14;
          if (uVar14 <= uVar23) {
            uVar21 = (ulong)(int)uVar14;
            pcVar8 = pBVar7[uVar21].super_RawBufferView.ptr_ofs;
            lVar16 = pBVar7[uVar21].super_RawBufferView.stride * uVar20;
            if (0.0 <= *(float *)(pcVar8 + lVar16 + 0xc)) {
              auVar29 = *(undefined1 (*) [16])(pcVar8 + lVar16);
              auVar27._8_4_ = 0xddccb9a2;
              auVar27._0_8_ = 0xddccb9a2ddccb9a2;
              auVar27._12_4_ = 0xddccb9a2;
              auVar28 = vcmpps_avx(auVar29,auVar27,2);
              auVar45._8_4_ = 0x5dccb9a2;
              auVar45._0_8_ = 0x5dccb9a25dccb9a2;
              auVar45._12_4_ = 0x5dccb9a2;
              auVar29 = vcmpps_avx(auVar29,auVar45,5);
              auVar29 = vorps_avx(auVar28,auVar29);
              uVar15 = vmovmskps_avx(auVar29);
              if ((char)uVar15 == '\0') {
                psVar22 = &pBVar7[uVar21 + 1].super_RawBufferView.stride;
                do {
                  uVar21 = uVar21 + 1;
                  bVar9 = (ulong)(long)(int)uVar23 < uVar21;
                  if ((ulong)(long)(int)uVar23 < uVar21) break;
                  pRVar1 = (RawBufferView *)(psVar22 + -2);
                  sVar24 = *psVar22;
                  if (*(float *)(pRVar1->ptr_ofs + sVar24 * uVar20 + 0xc) < 0.0) break;
                  psVar22 = psVar22 + 7;
                  auVar29 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + sVar24 * uVar20);
                  auVar33._8_4_ = 0xddccb9a2;
                  auVar33._0_8_ = 0xddccb9a2ddccb9a2;
                  auVar33._12_4_ = 0xddccb9a2;
                  auVar28 = vcmpps_avx(auVar29,auVar33,2);
                  auVar46._8_4_ = 0x5dccb9a2;
                  auVar46._0_8_ = 0x5dccb9a25dccb9a2;
                  auVar46._12_4_ = 0x5dccb9a2;
                  auVar29 = vcmpps_avx(auVar29,auVar46,5);
                  auVar29 = vorps_avx(auVar28,auVar29);
                  uVar15 = vmovmskps_avx(auVar29);
                } while ((char)uVar15 == '\0');
              }
            }
          }
        }
        else {
          bVar9 = false;
        }
        auVar50 = auVar64._0_16_;
        auVar54 = auVar63._0_16_;
        auVar29 = auVar54;
        auVar53 = auVar50;
        if (bVar9) {
          fVar3 = (this->super_Points).super_Geometry.time_range.lower;
          fVar26 = (this->super_Points).super_Geometry.time_range.upper - fVar3;
          fVar65 = (fVar25 - fVar3) / fVar26;
          fVar26 = (fVar30 - fVar3) / fVar26;
          fVar3 = fVar2 * fVar65;
          fVar51 = fVar2 * fVar26;
          auVar27 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
          auVar32 = vroundss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51),10);
          auVar29 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
          auVar28 = vminss_avx(auVar32,ZEXT416((uint)fVar2));
          fVar52 = auVar28._0_4_;
          iVar19 = (int)auVar27._0_4_;
          if (iVar19 < 0) {
            iVar19 = -1;
          }
          uVar14 = (int)fVar2 + 1U;
          if ((int)auVar32._0_4_ < (int)((int)fVar2 + 1U)) {
            uVar14 = (int)auVar32._0_4_;
          }
          lVar16 = (long)(int)auVar29._0_4_;
          pBVar7 = (this->super_Points).vertices.items;
          pcVar8 = pBVar7[lVar16].super_RawBufferView.ptr_ofs;
          lVar17 = pBVar7[lVar16].super_RawBufferView.stride * uVar13;
          auVar28 = *(undefined1 (*) [16])(pcVar8 + lVar17);
          fVar4 = (this->super_Points).maxRadiusScale;
          auVar27 = ZEXT416((uint)(fVar4 * *(float *)(pcVar8 + lVar17 + 0xc)));
          auVar27 = vshufps_avx(auVar27,auVar27,0);
          auVar32 = vsubps_avx(auVar28,auVar27);
          fVar31 = auVar28._0_4_ + auVar27._0_4_;
          fVar36 = auVar28._4_4_ + auVar27._4_4_;
          fVar37 = auVar28._8_4_ + auVar27._8_4_;
          fVar38 = auVar28._12_4_ + auVar27._12_4_;
          lVar17 = (long)(int)fVar52;
          pcVar8 = pBVar7[lVar17].super_RawBufferView.ptr_ofs;
          lVar18 = pBVar7[lVar17].super_RawBufferView.stride * uVar13;
          auVar28 = *(undefined1 (*) [16])(pcVar8 + lVar18);
          auVar27 = ZEXT416((uint)(fVar4 * *(float *)(pcVar8 + lVar18 + 0xc)));
          auVar27 = vshufps_avx(auVar27,auVar27,0);
          auVar45 = vsubps_avx(auVar28,auVar27);
          fVar39 = auVar28._0_4_ + auVar27._0_4_;
          fVar42 = auVar28._4_4_ + auVar27._4_4_;
          fVar43 = auVar28._8_4_ + auVar27._8_4_;
          fVar44 = auVar28._12_4_ + auVar27._12_4_;
          auVar29 = ZEXT416((uint)(fVar3 - auVar29._0_4_));
          fVar60 = auVar45._0_4_;
          fVar55 = auVar32._0_4_;
          fVar61 = auVar45._4_4_;
          fVar48 = auVar45._8_4_;
          fVar3 = auVar45._12_4_;
          fVar56 = auVar32._4_4_;
          fVar57 = auVar32._8_4_;
          fVar58 = auVar32._12_4_;
          if (uVar14 - iVar19 == 1) {
            auVar29 = vmaxss_avx(auVar29,ZEXT816(0));
            auVar28 = vshufps_avx(auVar29,auVar29,0);
            auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
            auVar27 = vshufps_avx(auVar29,auVar29,0);
            auVar29._0_4_ = fVar55 * auVar27._0_4_ + auVar28._0_4_ * fVar60;
            auVar29._4_4_ = fVar56 * auVar27._4_4_ + auVar28._4_4_ * fVar61;
            auVar29._8_4_ = fVar57 * auVar27._8_4_ + auVar28._8_4_ * fVar48;
            auVar29._12_4_ = fVar58 * auVar27._12_4_ + auVar28._12_4_ * fVar3;
            auVar50._0_4_ = auVar28._0_4_ * fVar39 + fVar31 * auVar27._0_4_;
            auVar50._4_4_ = auVar28._4_4_ * fVar42 + fVar36 * auVar27._4_4_;
            auVar50._8_4_ = auVar28._8_4_ * fVar43 + fVar37 * auVar27._8_4_;
            auVar50._12_4_ = auVar28._12_4_ * fVar44 + fVar38 * auVar27._12_4_;
            auVar28 = vmaxss_avx(ZEXT416((uint)(fVar52 - fVar51)),ZEXT816(0));
            auVar27 = vshufps_avx(auVar28,auVar28,0);
            auVar28 = ZEXT416((uint)(1.0 - auVar28._0_4_));
            auVar28 = vshufps_avx(auVar28,auVar28,0);
            auVar54._0_4_ = fVar55 * auVar27._0_4_ + fVar60 * auVar28._0_4_;
            auVar54._4_4_ = fVar56 * auVar27._4_4_ + fVar61 * auVar28._4_4_;
            auVar54._8_4_ = fVar57 * auVar27._8_4_ + fVar48 * auVar28._8_4_;
            auVar54._12_4_ = fVar58 * auVar27._12_4_ + fVar3 * auVar28._12_4_;
            auVar53._0_4_ = fVar31 * auVar27._0_4_ + fVar39 * auVar28._0_4_;
            auVar53._4_4_ = fVar36 * auVar27._4_4_ + fVar42 * auVar28._4_4_;
            auVar53._8_4_ = fVar37 * auVar27._8_4_ + fVar43 * auVar28._8_4_;
            auVar53._12_4_ = fVar38 * auVar27._12_4_ + fVar44 * auVar28._12_4_;
          }
          else {
            pcVar8 = pBVar7[lVar16 + 1].super_RawBufferView.ptr_ofs;
            lVar16 = pBVar7[lVar16 + 1].super_RawBufferView.stride * uVar13;
            auVar28 = *(undefined1 (*) [16])(pcVar8 + lVar16);
            fVar5 = *(float *)(pcVar8 + lVar16 + 0xc);
            auVar59._0_4_ = fVar4 * fVar5;
            auVar59._4_4_ = fVar4 * fVar5;
            auVar59._8_4_ = fVar4 * fVar5;
            auVar59._12_4_ = fVar4 * fVar5;
            auVar33 = vsubps_avx(auVar28,auVar59);
            pcVar8 = pBVar7[lVar17 + -1].super_RawBufferView.ptr_ofs;
            lVar16 = pBVar7[lVar17 + -1].super_RawBufferView.stride * uVar13;
            auVar27 = *(undefined1 (*) [16])(pcVar8 + lVar16);
            fVar5 = *(float *)(pcVar8 + lVar16 + 0xc);
            auVar62._0_4_ = fVar4 * fVar5;
            auVar62._4_4_ = fVar4 * fVar5;
            auVar62._8_4_ = fVar4 * fVar5;
            auVar62._12_4_ = fVar4 * fVar5;
            auVar46 = vsubps_avx(auVar27,auVar62);
            auVar29 = vmaxss_avx(auVar29,ZEXT816(0) << 0x20);
            auVar32 = vshufps_avx(auVar29,auVar29,0);
            auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
            auVar45 = vshufps_avx(auVar29,auVar29,0);
            auVar29._0_4_ = fVar55 * auVar45._0_4_ + auVar32._0_4_ * auVar33._0_4_;
            auVar29._4_4_ = fVar56 * auVar45._4_4_ + auVar32._4_4_ * auVar33._4_4_;
            auVar29._8_4_ = fVar57 * auVar45._8_4_ + auVar32._8_4_ * auVar33._8_4_;
            auVar29._12_4_ = fVar58 * auVar45._12_4_ + auVar32._12_4_ * auVar33._12_4_;
            auVar50._0_4_ = auVar45._0_4_ * fVar31 + auVar32._0_4_ * (auVar59._0_4_ + auVar28._0_4_)
            ;
            auVar50._4_4_ = auVar45._4_4_ * fVar36 + auVar32._4_4_ * (auVar59._4_4_ + auVar28._4_4_)
            ;
            auVar50._8_4_ = auVar45._8_4_ * fVar37 + auVar32._8_4_ * (auVar59._8_4_ + auVar28._8_4_)
            ;
            auVar50._12_4_ =
                 auVar45._12_4_ * fVar38 + auVar32._12_4_ * (auVar59._12_4_ + auVar28._12_4_);
            auVar28 = vmaxss_avx(ZEXT416((uint)(fVar52 - fVar51)),ZEXT416(0));
            auVar32 = vshufps_avx(auVar28,auVar28,0);
            auVar28 = ZEXT416((uint)(1.0 - auVar28._0_4_));
            auVar28 = vshufps_avx(auVar28,auVar28,0);
            auVar54._0_4_ = fVar60 * auVar28._0_4_ + auVar32._0_4_ * auVar46._0_4_;
            auVar54._4_4_ = fVar61 * auVar28._4_4_ + auVar32._4_4_ * auVar46._4_4_;
            auVar54._8_4_ = fVar48 * auVar28._8_4_ + auVar32._8_4_ * auVar46._8_4_;
            auVar54._12_4_ = fVar3 * auVar28._12_4_ + auVar32._12_4_ * auVar46._12_4_;
            auVar53._0_4_ = fVar39 * auVar28._0_4_ + (auVar27._0_4_ + auVar62._0_4_) * auVar32._0_4_
            ;
            auVar53._4_4_ = fVar42 * auVar28._4_4_ + (auVar27._4_4_ + auVar62._4_4_) * auVar32._4_4_
            ;
            auVar53._8_4_ = fVar43 * auVar28._8_4_ + (auVar27._8_4_ + auVar62._8_4_) * auVar32._8_4_
            ;
            auVar53._12_4_ =
                 fVar44 * auVar28._12_4_ + (auVar27._12_4_ + auVar62._12_4_) * auVar32._12_4_;
            uVar23 = iVar19 + 1;
            if ((int)uVar23 < (int)uVar14) {
              psVar22 = &pBVar7[uVar23].super_RawBufferView.stride;
              auVar63 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar64 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              do {
                auVar34._0_4_ = ((float)(int)uVar23 / fVar2 - fVar65) / (fVar26 - fVar65);
                auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar28 = vshufps_avx(auVar34,auVar34,0);
                fVar39 = auVar54._4_4_;
                fVar42 = auVar54._8_4_;
                fVar43 = auVar54._12_4_;
                auVar27 = vshufps_avx(ZEXT416((uint)(1.0 - auVar34._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar34._0_4_)),0);
                fVar44 = auVar29._4_4_;
                fVar60 = auVar29._8_4_;
                fVar61 = auVar29._12_4_;
                auVar47._0_4_ = auVar54._0_4_ * auVar28._0_4_ + auVar29._0_4_ * auVar27._0_4_;
                auVar47._4_4_ = fVar39 * auVar28._4_4_ + fVar44 * auVar27._4_4_;
                auVar47._8_4_ = fVar42 * auVar28._8_4_ + fVar60 * auVar27._8_4_;
                auVar47._12_4_ = fVar43 * auVar28._12_4_ + fVar61 * auVar27._12_4_;
                fVar36 = auVar53._4_4_;
                fVar37 = auVar53._8_4_;
                fVar38 = auVar53._12_4_;
                fVar51 = auVar50._4_4_;
                fVar52 = auVar50._8_4_;
                fVar31 = auVar50._12_4_;
                auVar35._0_4_ = auVar53._0_4_ * auVar28._0_4_ + auVar50._0_4_ * auVar27._0_4_;
                auVar35._4_4_ = fVar36 * auVar28._4_4_ + fVar51 * auVar27._4_4_;
                auVar35._8_4_ = fVar37 * auVar28._8_4_ + fVar52 * auVar27._8_4_;
                auVar35._12_4_ = fVar38 * auVar28._12_4_ + fVar31 * auVar27._12_4_;
                auVar28 = *(undefined1 (*) [16])
                           (((RawBufferView *)(psVar22 + -2))->ptr_ofs + *psVar22 * uVar13);
                fVar3 = *(float *)(((RawBufferView *)(psVar22 + -2))->ptr_ofs +
                                  *psVar22 * uVar13 + 0xc);
                auVar49._0_4_ = fVar4 * fVar3;
                auVar49._4_4_ = fVar4 * fVar3;
                auVar49._8_4_ = fVar4 * fVar3;
                auVar49._12_4_ = fVar4 * fVar3;
                auVar27 = vsubps_avx(auVar28,auVar49);
                auVar27 = vsubps_avx(auVar27,auVar47);
                auVar40._0_4_ = auVar28._0_4_ + auVar49._0_4_;
                auVar40._4_4_ = auVar28._4_4_ + auVar49._4_4_;
                auVar40._8_4_ = auVar28._8_4_ + auVar49._8_4_;
                auVar40._12_4_ = auVar28._12_4_ + auVar49._12_4_;
                auVar28 = vsubps_avx(auVar40,auVar35);
                auVar27 = vminps_avx(auVar27,ZEXT816(0) << 0x20);
                auVar28 = vmaxps_avx(auVar28,ZEXT816(0) << 0x20);
                auVar29._0_4_ = auVar29._0_4_ + auVar27._0_4_;
                auVar29._4_4_ = fVar44 + auVar27._4_4_;
                auVar29._8_4_ = fVar60 + auVar27._8_4_;
                auVar29._12_4_ = fVar61 + auVar27._12_4_;
                auVar54._0_4_ = auVar54._0_4_ + auVar27._0_4_;
                auVar54._4_4_ = fVar39 + auVar27._4_4_;
                auVar54._8_4_ = fVar42 + auVar27._8_4_;
                auVar54._12_4_ = fVar43 + auVar27._12_4_;
                auVar50._0_4_ = auVar50._0_4_ + auVar28._0_4_;
                auVar50._4_4_ = fVar51 + auVar28._4_4_;
                auVar50._8_4_ = fVar52 + auVar28._8_4_;
                auVar50._12_4_ = fVar31 + auVar28._12_4_;
                auVar53._0_4_ = auVar53._0_4_ + auVar28._0_4_;
                auVar53._4_4_ = fVar36 + auVar28._4_4_;
                auVar53._8_4_ = fVar37 + auVar28._8_4_;
                auVar53._12_4_ = fVar38 + auVar28._12_4_;
                uVar23 = uVar23 + 1;
                psVar22 = psVar22 + 7;
              } while (uVar14 != uVar23);
            }
            else {
              auVar63 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar64 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            }
          }
        }
        sVar24 = k;
        if (bVar9) {
          auVar29 = vminps_avx(auVar29,auVar54);
          aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar29,ZEXT416(geomID),0x30);
          auVar29 = vmaxps_avx(auVar50,auVar53);
          aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar29,ZEXT416((uint)uVar13),0x30);
          local_68 = vminps_avx(local_68,(undefined1  [16])aVar10);
          local_78 = vmaxps_avx(local_78,(undefined1  [16])aVar11);
          auVar41._0_4_ = aVar10.x + aVar11.x;
          auVar41._4_4_ = aVar10.y + aVar11.y;
          auVar41._8_4_ = aVar10.z + aVar11.z;
          auVar41._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
          local_88 = vminps_avx(local_88,auVar41);
          local_98 = vmaxps_avx(local_98,auVar41);
          sVar12 = sVar12 + 1;
          sVar24 = k + 1;
          prims[k].lower.field_0.field_1 = aVar10;
          prims[k].upper.field_0.field_1 = aVar11;
        }
        uVar13 = uVar13 + 1;
        k = sVar24;
      } while (uVar13 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_68._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_68._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_78._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_78._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_88._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_88._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_98._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_98._8_8_;
    __return_storage_ptr__->end = sVar12;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }